

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteRegistry::~ParameterizedTestSuiteRegistry
          (ParameterizedTestSuiteRegistry *this)

{
  bool bVar1;
  iterator this_00;
  reference ppPVar2;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
  *in_RDI;
  ParameterizedTestSuiteInfoBase **test_suite_info;
  iterator __end2;
  iterator __begin2;
  TestSuiteInfoContainer *__range2;
  ParameterizedTestSuiteInfoBase *in_stack_ffffffffffffffc8;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (ParameterizedTestSuiteInfoBase **)
       std::
       vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
       ::begin((vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                *)in_stack_ffffffffffffffc8);
  this_00 = std::
            vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ::end((vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                   *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
              ::operator*(local_18);
    in_stack_ffffffffffffffc8 = *ppPVar2;
    if (in_stack_ffffffffffffffc8 != (ParameterizedTestSuiteInfoBase *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffc8 + 8))();
    }
    __gnu_cxx::
    __normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
    ::operator++(local_18);
  }
  std::
  vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
  ::~vector((vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
             *)this_00._M_current);
  return;
}

Assistant:

~ParameterizedTestSuiteRegistry() {
    for (auto& test_suite_info : test_suite_infos_) {
      delete test_suite_info;
    }
  }